

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase581::run(TestCase581 *this)

{
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  int iVar3;
  Builder *params;
  Builder *extraout_RDX;
  Builder *extraout_RDX_00;
  Builder *extraout_RDX_01;
  Builder *params_00;
  bool bVar4;
  Reader value;
  Builder root;
  MallocMessageBuilder builder;
  Builder local_178;
  StructBuilder local_160;
  Builder local_138;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_178,&local_108.super_MessageBuilder);
  local_138._builder.data = local_178.builder.pointer;
  local_138._builder.segment = local_178.builder.segment;
  local_138._builder.capTable = local_178.builder.capTable;
  PointerBuilder::initStruct(&local_160,(PointerBuilder *)&local_138,(StructSize)0x20008);
  *(undefined2 *)&((WireValue<uint32_t>_conflict *)local_160.data)->value = 3;
  *(undefined2 *)&(((WirePointer *)((long)local_160.data + 8))->offsetAndKind).value = 0x7b;
  *(undefined2 *)((long)&((WireValue<uint32_t>_conflict *)local_160.data)->value + 2) = 0xb;
  local_138._builder.data = local_160.pointers + 1;
  local_138._builder.segment = local_160.segment;
  local_138._builder.capTable = local_160.capTable;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_138,value);
  (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_160.data + 4))->structRef).dataSize.
  value = 0;
  *(byte *)&(((WirePointer *)((long)local_160.data + 0x20))->offsetAndKind).value =
       (byte)(((WirePointer *)((long)local_160.data + 0x20))->offsetAndKind).value | 1;
  (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_160.data + 4))->structRef).ptrCount.
  value = 4;
  ((WirePointer *)((long)local_160.data + 0x38))->offsetAndKind = 0xa630f34e;
  ((WirePointer *)((long)local_160.data + 0x38))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x1b69b4b;
  kj::str<capnproto_test::capnp::test::TestUnion::Builder&>
            ((String *)&local_138,(kj *)&local_160,params);
  pCVar2 = local_138._builder.capTable;
  bVar4 = true;
  params_00 = extraout_RDX;
  if (local_138._builder.capTable == (CapTableBuilder *)0xe6) {
    iVar3 = bcmp(local_138._builder.segment,
                 "(union0 = (u0f0s16 = 123), union1 = (u1f0sp = \"foo\"), union2 = (u2f0s1 = true), union3 = (u3f0s64 = 123456789012345678), bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, bit6 = false, bit7 = false, byte0 = 0)"
                 ,0xe5);
    bVar4 = iVar3 != 0;
    params_00 = extraout_RDX_00;
  }
  pSVar1 = local_138._builder.segment;
  if (local_138._builder.segment != (SegmentBuilder *)0x0) {
    local_138._builder.segment = (SegmentBuilder *)0x0;
    local_138._builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)*local_138._builder.data)(local_138._builder.data,pSVar1,1,pCVar2,pCVar2,0);
    params_00 = extraout_RDX_01;
  }
  if ((bool)(bVar4 & kj::_::Debug::minSeverity < 3)) {
    kj::str<capnproto_test::capnp::test::TestUnion::Builder&>
              ((String *)&local_138,(kj *)&local_160,params_00);
    kj::_::Debug::log<char_const(&)[290],char_const(&)[230],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x255,ERROR,
               "\"failed: expected \" \"(\\\"(\\\" \\\"union0 = (u0f0s16 = 123), \\\" \\\"union1 = (u1f0sp = \\\\\\\"foo\\\\\\\"), \\\" \\\"union2 = (u2f0s1 = true), \\\" \\\"union3 = (u3f0s64 = 123456789012345678), \\\" \\\"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \\\" \\\"bit6 = false, bit7 = false, byte0 = 0)\\\") == (kj::str(root))\", \"(\" \"union0 = (u0f0s16 = 123), \" \"union1 = (u1f0sp = \\\"foo\\\"), \" \"union2 = (u2f0s1 = true), \" \"union3 = (u3f0s64 = 123456789012345678), \" \"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \" \"bit6 = false, bit7 = false, byte0 = 0)\", kj::str(root)"
               ,(char (*) [290])
                "failed: expected (\"(\" \"union0 = (u0f0s16 = 123), \" \"union1 = (u1f0sp = \\\"foo\\\"), \" \"union2 = (u2f0s1 = true), \" \"union3 = (u3f0s64 = 123456789012345678), \" \"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \" \"bit6 = false, bit7 = false, byte0 = 0)\") == (kj::str(root))"
               ,(char (*) [230])
                "(union0 = (u0f0s16 = 123), union1 = (u1f0sp = \"foo\"), union2 = (u2f0s1 = true), union3 = (u3f0s64 = 123456789012345678), bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, bit6 = false, bit7 = false, byte0 = 0)"
               ,(String *)&local_138);
    pCVar2 = local_138._builder.capTable;
    pSVar1 = local_138._builder.segment;
    if (local_138._builder.segment != (SegmentBuilder *)0x0) {
      local_138._builder.segment = (SegmentBuilder *)0x0;
      local_138._builder.capTable = (CapTableBuilder *)0x0;
      (**(code **)*local_138._builder.data)(local_138._builder.data,pSVar1,1,pCVar2,pCVar2,0);
    }
  }
  local_138._builder.dataSize = local_160.dataSize;
  local_138._builder.pointerCount = local_160.pointerCount;
  local_138._builder._38_2_ = local_160._38_2_;
  local_138._builder.data = local_160.data;
  local_138._builder.pointers = local_160.pointers;
  local_138._builder.segment = local_160.segment;
  local_138._builder.capTable = local_160.capTable;
  kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>((String *)&local_178,&local_138);
  pCVar2 = local_178.builder.capTable;
  bVar4 = true;
  if (local_178.builder.capTable == (CapTableBuilder *)&DAT_00000010) {
    iVar3 = bcmp(local_178.builder.segment,"(u0f0s16 = 123)",0xf);
    bVar4 = iVar3 != 0;
  }
  pSVar1 = local_178.builder.segment;
  if (local_178.builder.segment != (SegmentBuilder *)0x0) {
    local_178.builder.segment = (SegmentBuilder *)0x0;
    local_178.builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)*local_178.builder.pointer)(local_178.builder.pointer,pSVar1,1,pCVar2,pCVar2,0);
  }
  if ((bool)(bVar4 & kj::_::Debug::minSeverity < 3)) {
    local_138._builder.dataSize = local_160.dataSize;
    local_138._builder.pointerCount = local_160.pointerCount;
    local_138._builder._38_2_ = local_160._38_2_;
    local_138._builder.data = local_160.data;
    local_138._builder.pointers = local_160.pointers;
    local_138._builder.segment = local_160.segment;
    local_138._builder.capTable = local_160.capTable;
    kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>
              ((String *)&local_178,&local_138);
    kj::_::Debug::log<char_const(&)[68],char_const(&)[16],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,599,ERROR,
               "\"failed: expected \" \"(\\\"(u0f0s16 = 123)\\\") == (kj::str(root.getUnion0()))\", \"(u0f0s16 = 123)\", kj::str(root.getUnion0())"
               ,(char (*) [68])
                "failed: expected (\"(u0f0s16 = 123)\") == (kj::str(root.getUnion0()))",
               (char (*) [16])"(u0f0s16 = 123)",(String *)&local_178);
    pCVar2 = local_178.builder.capTable;
    pSVar1 = local_178.builder.segment;
    if (local_178.builder.segment != (SegmentBuilder *)0x0) {
      local_178.builder.segment = (SegmentBuilder *)0x0;
      local_178.builder.capTable = (CapTableBuilder *)0x0;
      (**(code **)*local_178.builder.pointer)(local_178.builder.pointer,pSVar1,1,pCVar2,pCVar2,0);
    }
  }
  local_138._builder.dataSize = local_160.dataSize;
  local_138._builder.pointerCount = local_160.pointerCount;
  local_138._builder._38_2_ = local_160._38_2_;
  local_138._builder.data = local_160.data;
  local_138._builder.pointers = local_160.pointers;
  local_138._builder.segment = local_160.segment;
  local_138._builder.capTable = local_160.capTable;
  kj::str<capnproto_test::capnp::test::TestUnion::Union1::Builder>
            ((String *)&local_178,(Builder *)&local_138);
  pCVar2 = local_178.builder.capTable;
  bVar4 = true;
  if (local_178.builder.capTable == (CapTableBuilder *)0x11) {
    iVar3 = bcmp(local_178.builder.segment,"(u1f0sp = \"foo\")",0x10);
    bVar4 = iVar3 != 0;
  }
  pSVar1 = local_178.builder.segment;
  if (local_178.builder.segment != (SegmentBuilder *)0x0) {
    local_178.builder.segment = (SegmentBuilder *)0x0;
    local_178.builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)*local_178.builder.pointer)(local_178.builder.pointer,pSVar1,1,pCVar2,pCVar2,0);
  }
  if ((bool)(bVar4 & kj::_::Debug::minSeverity < 3)) {
    local_138._builder.dataSize = local_160.dataSize;
    local_138._builder.pointerCount = local_160.pointerCount;
    local_138._builder._38_2_ = local_160._38_2_;
    local_138._builder.data = local_160.data;
    local_138._builder.pointers = local_160.pointers;
    local_138._builder.segment = local_160.segment;
    local_138._builder.capTable = local_160.capTable;
    kj::str<capnproto_test::capnp::test::TestUnion::Union1::Builder>
              ((String *)&local_178,(Builder *)&local_138);
    kj::_::Debug::log<char_const(&)[71],char_const(&)[17],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,600,ERROR,
               "\"failed: expected \" \"(\\\"(u1f0sp = \\\\\\\"foo\\\\\\\")\\\") == (kj::str(root.getUnion1()))\", \"(u1f0sp = \\\"foo\\\")\", kj::str(root.getUnion1())"
               ,(char (*) [71])
                "failed: expected (\"(u1f0sp = \\\"foo\\\")\") == (kj::str(root.getUnion1()))",
               (char (*) [17])"(u1f0sp = \"foo\")",(String *)&local_178);
    pCVar2 = local_178.builder.capTable;
    pSVar1 = local_178.builder.segment;
    if (local_178.builder.segment != (SegmentBuilder *)0x0) {
      local_178.builder.segment = (SegmentBuilder *)0x0;
      local_178.builder.capTable = (CapTableBuilder *)0x0;
      (**(code **)*local_178.builder.pointer)(local_178.builder.pointer,pSVar1,1,pCVar2,pCVar2,0);
    }
  }
  local_138._builder.dataSize = local_160.dataSize;
  local_138._builder.pointerCount = local_160.pointerCount;
  local_138._builder._38_2_ = local_160._38_2_;
  local_138._builder.data = local_160.data;
  local_138._builder.pointers = local_160.pointers;
  local_138._builder.segment = local_160.segment;
  local_138._builder.capTable = local_160.capTable;
  kj::str<capnproto_test::capnp::test::TestUnion::Union2::Builder>
            ((String *)&local_178,(Builder *)&local_138);
  pCVar2 = local_178.builder.capTable;
  bVar4 = true;
  if (local_178.builder.capTable == (CapTableBuilder *)&DAT_00000010) {
    iVar3 = bcmp(local_178.builder.segment,"(u2f0s1 = true)",0xf);
    bVar4 = iVar3 != 0;
  }
  pSVar1 = local_178.builder.segment;
  if (local_178.builder.segment != (SegmentBuilder *)0x0) {
    local_178.builder.segment = (SegmentBuilder *)0x0;
    local_178.builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)*local_178.builder.pointer)(local_178.builder.pointer,pSVar1,1,pCVar2,pCVar2,0);
  }
  if ((bool)(bVar4 & kj::_::Debug::minSeverity < 3)) {
    local_138._builder.dataSize = local_160.dataSize;
    local_138._builder.pointerCount = local_160.pointerCount;
    local_138._builder._38_2_ = local_160._38_2_;
    local_138._builder.data = local_160.data;
    local_138._builder.pointers = local_160.pointers;
    local_138._builder.segment = local_160.segment;
    local_138._builder.capTable = local_160.capTable;
    kj::str<capnproto_test::capnp::test::TestUnion::Union2::Builder>
              ((String *)&local_178,(Builder *)&local_138);
    kj::_::Debug::log<char_const(&)[68],char_const(&)[16],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x259,ERROR,
               "\"failed: expected \" \"(\\\"(u2f0s1 = true)\\\") == (kj::str(root.getUnion2()))\", \"(u2f0s1 = true)\", kj::str(root.getUnion2())"
               ,(char (*) [68])
                "failed: expected (\"(u2f0s1 = true)\") == (kj::str(root.getUnion2()))",
               (char (*) [16])"(u2f0s1 = true)",(String *)&local_178);
    pCVar2 = local_178.builder.capTable;
    pSVar1 = local_178.builder.segment;
    if (local_178.builder.segment != (SegmentBuilder *)0x0) {
      local_178.builder.segment = (SegmentBuilder *)0x0;
      local_178.builder.capTable = (CapTableBuilder *)0x0;
      (**(code **)*local_178.builder.pointer)(local_178.builder.pointer,pSVar1,1,pCVar2,pCVar2,0);
    }
  }
  local_138._builder.dataSize = local_160.dataSize;
  local_138._builder.pointerCount = local_160.pointerCount;
  local_138._builder._38_2_ = local_160._38_2_;
  local_138._builder.data = local_160.data;
  local_138._builder.pointers = local_160.pointers;
  local_138._builder.segment = local_160.segment;
  local_138._builder.capTable = local_160.capTable;
  kj::str<capnproto_test::capnp::test::TestUnion::Union3::Builder>
            ((String *)&local_178,(Builder *)&local_138);
  pCVar2 = local_178.builder.capTable;
  bVar4 = true;
  if (local_178.builder.capTable == (CapTableBuilder *)0x1f) {
    iVar3 = bcmp(local_178.builder.segment,"(u3f0s64 = 123456789012345678)",0x1e);
    bVar4 = iVar3 != 0;
  }
  pSVar1 = local_178.builder.segment;
  if (local_178.builder.segment != (SegmentBuilder *)0x0) {
    local_178.builder.segment = (SegmentBuilder *)0x0;
    local_178.builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)*local_178.builder.pointer)(local_178.builder.pointer,pSVar1,1,pCVar2,pCVar2,0);
  }
  if ((bool)(bVar4 & kj::_::Debug::minSeverity < 3)) {
    local_138._builder.dataSize = local_160.dataSize;
    local_138._builder.pointerCount = local_160.pointerCount;
    local_138._builder._38_2_ = local_160._38_2_;
    local_138._builder.data = local_160.data;
    local_138._builder.pointers = local_160.pointers;
    local_138._builder.segment = local_160.segment;
    local_138._builder.capTable = local_160.capTable;
    kj::str<capnproto_test::capnp::test::TestUnion::Union3::Builder>
              ((String *)&local_178,(Builder *)&local_138);
    kj::_::Debug::log<char_const(&)[83],char_const(&)[31],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
               ,0x25a,ERROR,
               "\"failed: expected \" \"(\\\"(u3f0s64 = 123456789012345678)\\\") == (kj::str(root.getUnion3()))\", \"(u3f0s64 = 123456789012345678)\", kj::str(root.getUnion3())"
               ,(char (*) [83])
                "failed: expected (\"(u3f0s64 = 123456789012345678)\") == (kj::str(root.getUnion3()))"
               ,(char (*) [31])"(u3f0s64 = 123456789012345678)",(String *)&local_178);
    pCVar2 = local_178.builder.capTable;
    pSVar1 = local_178.builder.segment;
    if (local_178.builder.segment != (SegmentBuilder *)0x0) {
      local_178.builder.segment = (SegmentBuilder *)0x0;
      local_178.builder.capTable = (CapTableBuilder *)0x0;
      (**(code **)*local_178.builder.pointer)(local_178.builder.pointer,pSVar1,1,pCVar2,pCVar2,0);
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(Stringify, Unions) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestUnion>();

  root.getUnion0().setU0f0s16(123);
  root.getUnion1().setU1f0sp("foo");
  root.getUnion2().setU2f0s1(true);
  root.getUnion3().setU3f0s64(123456789012345678ll);

  EXPECT_EQ("("
      "union0 = (u0f0s16 = 123), "
      "union1 = (u1f0sp = \"foo\"), "
      "union2 = (u2f0s1 = true), "
      "union3 = (u3f0s64 = 123456789012345678), "
      "bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, "
      "bit6 = false, bit7 = false, byte0 = 0)",
      kj::str(root));

  EXPECT_EQ("(u0f0s16 = 123)", kj::str(root.getUnion0()));
  EXPECT_EQ("(u1f0sp = \"foo\")", kj::str(root.getUnion1()));
  EXPECT_EQ("(u2f0s1 = true)", kj::str(root.getUnion2()));
  EXPECT_EQ("(u3f0s64 = 123456789012345678)", kj::str(root.getUnion3()));
}